

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectConstant<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::Equals>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t i;
  idx_t iVar3;
  idx_t iVar4;
  
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
      ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
       puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) &&
     (bVar2 = uhugeint_t::operator==((uhugeint_t *)left->data,(uhugeint_t *)right->data), bVar2)) {
    if (true_sel == (SelectionVector *)0x0) {
      return count;
    }
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar4 = iVar3;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)sel->sel_vector[iVar3];
      }
      true_sel->sel_vector[iVar3] = (sel_t)iVar4;
    }
    return count;
  }
  if (false_sel != (SelectionVector *)0x0) {
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar4 = iVar3;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)sel->sel_vector[iVar3];
      }
      false_sel->sel_vector[iVar3] = (sel_t)iVar4;
    }
  }
  return 0;
}

Assistant:

static idx_t SelectConstant(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                            SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);

		// both sides are constant, return either 0 or the count
		// in this case we do not fill in the result selection vector at all
		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right) || !OP::Operation(*ldata, *rdata)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		} else {
			if (true_sel) {
				for (idx_t i = 0; i < count; i++) {
					true_sel->set_index(i, sel->get_index(i));
				}
			}
			return count;
		}
	}